

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sort.cpp
# Opt level: O0

void ON_hsort(void *base,size_t nel,size_t width,_func_int_void_ptr_void_ptr *compar)

{
  size_t sVar1;
  int iVar2;
  uchar **local_b0;
  uchar *local_a8;
  uchar *e_j;
  uchar *e_i;
  size_t j;
  size_t i;
  uchar *e_end;
  uchar *e_tmp;
  uchar work_memory [64];
  size_t k;
  size_t i_end;
  _func_int_void_ptr_void_ptr *compar_local;
  size_t width_local;
  size_t nel_local;
  void *base_local;
  
  if (nel < 2) {
    return;
  }
  work_memory._56_8_ = nel >> 1;
  k = nel - 1;
  i = (long)base + k * width;
  if (width < 0x41) {
    local_b0 = &e_tmp;
  }
  else {
    local_b0 = (uchar **)onmalloc(width);
  }
  do {
    if (work_memory._56_8_ == 0) {
      memcpy(local_b0,(void *)i,width);
      memcpy((void *)i,base,width);
      k = k - 1;
      if (k == 0) {
        memcpy(base,local_b0,width);
        if (width < 0x41) {
          return;
        }
        onfree(local_b0);
        return;
      }
      i = i - width;
    }
    else {
      work_memory._56_8_ = work_memory._56_8_ + -1;
      memcpy(local_b0,(void *)((long)base + work_memory._56_8_ * width),width);
    }
    e_j = (uchar *)((long)base + work_memory._56_8_ * width);
    sVar1 = work_memory._56_8_ * 2;
    while (e_i = (uchar *)(sVar1 + 1), e_i <= k) {
      local_a8 = (uchar *)((long)base + (long)e_i * width);
      if ((e_i < k) && (iVar2 = (*compar)(local_a8,local_a8 + width), iVar2 < 0)) {
        e_i = (uchar *)(sVar1 + 2);
        local_a8 = local_a8 + width;
      }
      iVar2 = (*compar)(local_b0,local_a8);
      sVar1 = k;
      if (iVar2 < 0) {
        memcpy(e_j,local_a8,width);
        e_j = local_a8;
        sVar1 = (long)e_i * 2;
      }
    }
    memcpy(e_j,local_b0,width);
  } while( true );
}

Assistant:

void
ON_hsort(void *base, size_t nel, size_t width, int (*compar)(const void*,const void*))
{
  size_t
    i_end,k;
  unsigned char
    work_memory[work_size], *e_tmp, *e_end;

  if (nel < 2) return;
  k = nel >> 1;
  i_end = nel-1;
  e_end = ((unsigned char*)base) + i_end*width;
  e_tmp = (width > work_size) ? (unsigned char*)onmalloc(width) : work_memory;
  for (;;) {
    if (k) {
      --k;
      memcpy(e_tmp,((unsigned char*)base)+k*width,width); /* e_tmp = e[k]; */
    } 
    else {      
      memcpy(e_tmp,e_end,width);     /* e_tmp = e[i_end]; */
      memcpy(e_end,base,width);      /* e[i_end] = e[0];  */
      if (!(--i_end)) {
        memcpy(base,e_tmp,width);    /* e[0] = e_tmp;     */
        break;
      }
      e_end -= width;
    }
    { size_t i, j;
      unsigned char *e_i, *e_j;
      i = k;
      j = (k<<1) + 1;
      e_i = ((unsigned char*)base) + i*width;
      while (j <= i_end) {
        e_j = ((unsigned char*)base) + j*width;
        if (j < i_end && compar(e_j,e_j+width)<0 /*e[j] < e[j + 1] */)
          {j++; e_j += width;}
        if (compar(e_tmp,e_j)<0 /* e_tmp < e[j] */) {
          memcpy(e_i,e_j,width); /* e[i] = e[j]; */
          i = j;
          e_i = e_j;
          j = (j<<1) + 1;
        } else j = i_end + 1;
      }
      memcpy(e_i,e_tmp,width); /* e[i] = e_tmp; */
    }
  }
  if (width > work_size) onfree(e_tmp); 
}